

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O3

string * __thiscall
cmGeneratorExpressionEvaluationFile::GetInputFileName_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorExpressionEvaluationFile *this,
          cmLocalGenerator *lg)

{
  pointer pcVar1;
  bool bVar2;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->Input)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->Input)._M_string_length);
  bVar2 = cmsys::SystemTools::FileIsFullPath(__return_storage_ptr__);
  if (bVar2) {
    cmsys::SystemTools::CollapseFullPath(&local_40,__return_storage_ptr__);
  }
  else {
    FixRelativePath(&local_40,this,__return_storage_ptr__,PathForInput,lg);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpressionEvaluationFile::GetInputFileName(
  cmLocalGenerator* lg)
{
  std::string inputFileName = this->Input;

  if (cmSystemTools::FileIsFullPath(inputFileName)) {
    inputFileName = cmSystemTools::CollapseFullPath(inputFileName);
  } else {
    inputFileName = this->FixRelativePath(inputFileName, PathForInput, lg);
  }

  return inputFileName;
}